

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

ScenarioUpperBound * __thiscall
despot::POMDPX::CreateScenarioUpperBound(POMDPX *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  LookaheadUpperBound *this_00;
  undefined4 extraout_var;
  MDPUpperBound *this_01;
  ostream *poVar3;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->is_small_ == false) {
    this_01 = (MDPUpperBound *)operator_new(0x10);
    TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_01,&this->super_DSPOMDP);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      this_01 = (MDPUpperBound *)operator_new(0x10);
      TrivialParticleUpperBound::TrivialParticleUpperBound
                ((TrivialParticleUpperBound *)this_01,&this->super_DSPOMDP);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 != 0)) {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
          poVar3 = std::operator<<(poVar3,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar3);
          exit(1);
        }
        this_00 = (LookaheadUpperBound *)operator_new(0x38);
        pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
        iVar2 = (*(this->super_MDP)._vptr_MDP[0x11])(this,local_48);
        LookaheadUpperBound::LookaheadUpperBound
                  (this_00,&this->super_DSPOMDP,&this->super_StateIndexer,
                   (ParticleUpperBound *)CONCAT44(extraout_var,iVar2));
        if (local_48[0] == local_38) {
          return &this_00->super_ScenarioUpperBound;
        }
        operator_delete(local_48[0],local_38[0] + 1);
        return &this_00->super_ScenarioUpperBound;
      }
      this_01 = (MDPUpperBound *)operator_new(0x38);
      MDPUpperBound::MDPUpperBound(this_01,&this->super_MDP,&this->super_StateIndexer);
    }
  }
  return (ScenarioUpperBound *)this_01;
}

Assistant:

ScenarioUpperBound* POMDPX::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *indexer,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}